

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void ftghtb_(int *A1,int *A2,int *A3,int *A4,int *A5,char *A6,int *A7,char *A8,char *A9,char *A10,
            int *A11,size_t C6,size_t C8,size_t C9,size_t C10)

{
  long *B;
  char **__ptr;
  char **ppcVar1;
  char *pcVar2;
  char **B_00;
  char *s;
  size_t sVar3;
  size_t sVar4;
  int felem_len;
  int iVar5;
  int felem_len_00;
  int iVar6;
  int nelem;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  unsigned_long uVar10;
  long B4;
  long B3;
  char **local_90;
  long *local_88;
  char **local_80;
  ulong local_78;
  long local_70;
  char *local_68;
  ulong local_60;
  int *local_58;
  fitsfile *local_50;
  int *local_48;
  int *local_40;
  long tfields;
  
  local_50 = gFitsFiles[*A1];
  uVar8 = *A2;
  lVar9 = (long)(int)uVar8;
  local_68 = A6;
  local_58 = A4;
  local_48 = A3;
  local_40 = A5;
  ffgkyj(local_50,"TFIELDS",&tfields,(char *)0x0,A11);
  if (tfields < lVar9) {
    uVar8 = (uint)tfields;
  }
  local_60 = tfields & 0xffffffff;
  if (-1 < lVar9) {
    local_60 = (ulong)uVar8;
  }
  B3 = (long)*A3;
  uVar7 = 1;
  if (1 < (int)local_60) {
    uVar7 = local_60;
  }
  B4 = (long)*A4;
  uVar10 = C6;
  if (C6 < gMinStrLen) {
    uVar10 = gMinStrLen;
  }
  uVar8 = (int)uVar10 + 1;
  sVar3 = uVar7 * 8;
  ppcVar1 = (char **)malloc(sVar3);
  nelem = (int)uVar7;
  local_80 = ppcVar1;
  local_78 = (ulong)uVar8;
  pcVar2 = (char *)malloc((ulong)(uVar8 * nelem));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A6,pcVar2,(int)C6,uVar8,nelem);
  vindex(ppcVar1,uVar8,nelem,pcVar2);
  local_70 = (long)*A2;
  local_88 = F2Clongv(local_70,A7);
  felem_len = (int)C8;
  iVar5 = felem_len;
  if (C8 < gMinStrLen) {
    iVar5 = (int)gMinStrLen;
  }
  iVar5 = iVar5 + 1;
  ppcVar1 = (char **)malloc(sVar3);
  pcVar2 = (char *)malloc((ulong)(uint)(iVar5 * nelem));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A8,pcVar2,felem_len,iVar5,nelem);
  vindex(ppcVar1,iVar5,nelem,pcVar2);
  felem_len_00 = (int)C9;
  iVar6 = felem_len_00;
  if (C9 < gMinStrLen) {
    iVar6 = (int)gMinStrLen;
  }
  iVar6 = iVar6 + 1;
  B_00 = (char **)malloc(sVar3);
  pcVar2 = (char *)malloc((ulong)(uint)(iVar6 * nelem));
  *B_00 = pcVar2;
  pcVar2 = f2cstrv2(A9,pcVar2,felem_len_00,iVar6,nelem);
  local_90 = B_00;
  vindex(B_00,iVar6,nelem,pcVar2);
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C10) {
    sVar4 = C10;
  }
  s = (char *)malloc(sVar4 + 1);
  s[C10] = '\0';
  pcVar2 = A10;
  memcpy(s,A10,C10);
  kill_trailing(s,(char)pcVar2);
  __ptr = local_80;
  B = local_88;
  ffghtb(local_50,(int)local_60,&B3,&B4,local_40,local_80,local_88,ppcVar1,B_00,s,A11);
  *local_48 = (int)B3;
  *local_58 = (int)B4;
  c2fstrv2(*__ptr,local_68,(int)local_78,(int)C6,nelem);
  free(*__ptr);
  free(__ptr);
  C2Flongv(local_70,A7,B);
  c2fstrv2(*ppcVar1,A8,iVar5,felem_len,nelem);
  free(*ppcVar1);
  free(ppcVar1);
  ppcVar1 = local_90;
  c2fstrv2(*local_90,A9,iVar6,felem_len_00,nelem);
  free(*ppcVar1);
  free(ppcVar1);
  sVar3 = strlen(s);
  sVar4 = C10;
  if (sVar3 < C10) {
    sVar4 = sVar3;
  }
  memcpy(A10,s,sVar4);
  if (sVar3 <= C10 && C10 - sVar3 != 0) {
    memset(A10 + sVar3,0x20,C10 - sVar3);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTGHTB,ftghtb)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,PLONG,PLONG,PINT,PSTRINGV,LONGV,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(PLONG,3)
   QCF(PLONG,4)
   QCF(PINT,5)
   QCF(PSTRINGV,6)
   QCF(LONGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRINGV,9)
   QCF(PSTRING,10)
   QCF(PINT,11)

   fitsfile *fptr;
   long tfields;
   int maxdim,*status;

   fptr = TCF(ftghtb,FITSUNIT,1,0);
   status =  TCF(ftghtb,PINT,11,0);
   maxdim =  TCF(ftghtb,INT,2,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );
   maxdim = (maxdim<0) ? tfields : _cfMIN(tfields,maxdim);

   ffghtb(   fptr, maxdim
             TCF(ftghtb,PLONG,3,1)
             TCF(ftghtb,PLONG,4,1)
             TCF(ftghtb,PINT,5,1)
             TCF(ftghtb,PSTRINGV,6,1)
             TCF(ftghtb,LONGV,7,1)
             TCF(ftghtb,PSTRINGV,8,1)
             TCF(ftghtb,PSTRINGV,9,1)
             TCF(ftghtb,PSTRING,10,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(PLONG,3)
   RCF(PLONG,4)
   RCF(PINT,5)
   RCF(PSTRINGV,6)
   RCF(LONGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRINGV,9)
   RCF(PSTRING,10)
   RCF(PINT,11)
}